

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# zt_cstr.c
# Opt level: O0

char * zt_cstr_catv(char *s,...)

{
  char in_AL;
  ssize_t sVar1;
  size_t sVar2;
  long lVar3;
  undefined8 in_RCX;
  undefined8 in_RDX;
  undefined8 in_RSI;
  char *in_RDI;
  undefined8 in_R8;
  undefined8 in_R9;
  undefined8 in_XMM0_Qa;
  undefined8 in_XMM1_Qa;
  undefined8 in_XMM2_Qa;
  undefined8 in_XMM3_Qa;
  undefined8 in_XMM4_Qa;
  undefined8 in_XMM5_Qa;
  undefined8 in_XMM6_Qa;
  undefined8 in_XMM7_Qa;
  ssize_t t_1;
  size_t len_2;
  ssize_t t;
  size_t len_1;
  va_list ap;
  size_t len;
  ssize_t j;
  ssize_t i;
  char *save;
  char *p;
  char *new;
  int *in_stack_fffffffffffffe48;
  uint *in_stack_fffffffffffffe50;
  int *local_1a0;
  int *local_188;
  int *local_170;
  int *local_158;
  int *local_140;
  undefined1 local_128 [8];
  undefined8 local_120;
  undefined8 local_118;
  undefined8 local_110;
  undefined8 local_108;
  undefined8 local_100;
  undefined8 local_f8;
  undefined8 local_e8;
  undefined8 local_d8;
  undefined8 local_c8;
  undefined8 local_b8;
  undefined8 local_a8;
  undefined8 local_98;
  undefined8 local_88;
  long local_78;
  size_t local_70;
  long local_68;
  size_t local_60;
  uint local_58 [2];
  int *local_50;
  undefined1 *local_48;
  long local_38;
  ssize_t local_30;
  ssize_t local_28;
  char *local_20;
  char *local_18;
  char *local_10;
  char *local_8;
  
  if (in_AL != '\0') {
    local_f8 = in_XMM0_Qa;
    local_e8 = in_XMM1_Qa;
    local_d8 = in_XMM2_Qa;
    local_c8 = in_XMM3_Qa;
    local_b8 = in_XMM4_Qa;
    local_a8 = in_XMM5_Qa;
    local_98 = in_XMM6_Qa;
    local_88 = in_XMM7_Qa;
  }
  local_38 = 0;
  local_48 = local_128;
  local_50 = (int *)&stack0x00000008;
  local_58[1] = 0x30;
  local_58[0] = 8;
  local_120 = in_RSI;
  local_118 = in_RDX;
  local_110 = in_RCX;
  local_108 = in_R8;
  local_100 = in_R9;
  local_20 = in_RDI;
  local_8 = in_RDI;
  while (local_8 != (char *)0x0) {
    if (local_58[0] < 0x29) {
      local_140 = (int *)(local_48 + (int)local_58[0]);
      local_58[0] = local_58[0] + 8;
    }
    else {
      local_140 = local_50;
      local_50 = local_50 + 2;
    }
    local_28 = (ssize_t)*local_140;
    if (local_58[0] < 0x29) {
      local_158 = (int *)(local_48 + (int)local_58[0]);
      local_58[0] = local_58[0] + 8;
    }
    else {
      local_158 = local_50;
      local_50 = local_50 + 2;
    }
    local_30 = (ssize_t)*local_158;
    local_60 = strlen(local_8);
    if (local_60 == 0) {
      local_28 = 0;
      local_30 = 0;
    }
    else {
      local_28 = IDX((ssize_t)in_stack_fffffffffffffe50,(size_t)in_stack_fffffffffffffe48);
      sVar1 = IDX((ssize_t)in_stack_fffffffffffffe50,(size_t)in_stack_fffffffffffffe48);
      local_30 = sVar1;
      if (sVar1 < local_28) {
        local_68 = local_28;
        local_30 = local_28;
        local_28 = sVar1;
      }
    }
    sVar2 = IDXLEN(local_28,local_30);
    local_38 = sVar2 + 1 + local_38;
    if (local_58[0] < 0x29) {
      local_170 = (int *)(local_48 + (int)local_58[0]);
      local_58[0] = local_58[0] + 8;
    }
    else {
      local_170 = local_50;
      local_50 = local_50 + 2;
    }
    local_8 = *(char **)local_170;
  }
  local_18 = (char *)zt_malloc_p((size_t)in_stack_fffffffffffffe50);
  local_48 = local_128;
  local_50 = (int *)&stack0x00000008;
  local_58[1] = 0x30;
  local_58[0] = 8;
  local_8 = local_20;
  local_10 = local_18;
  while (local_8 != (char *)0x0) {
    if (local_58[0] < 0x29) {
      local_188 = (int *)(local_48 + (int)local_58[0]);
      local_58[0] = local_58[0] + 8;
    }
    else {
      local_188 = local_50;
      local_50 = local_50 + 2;
    }
    local_28 = (ssize_t)*local_188;
    if (local_58[0] < 0x29) {
      local_1a0 = (int *)(local_48 + (int)local_58[0]);
      local_58[0] = local_58[0] + 8;
    }
    else {
      local_1a0 = local_50;
      local_50 = local_50 + 2;
    }
    local_30 = (ssize_t)*local_1a0;
    local_70 = strlen(local_8);
    if (local_70 == 0) {
      local_28 = 0;
      local_30 = 0;
    }
    else {
      local_28 = IDX((ssize_t)in_stack_fffffffffffffe50,(size_t)in_stack_fffffffffffffe48);
      sVar1 = IDX((ssize_t)in_stack_fffffffffffffe50,(size_t)in_stack_fffffffffffffe48);
      local_30 = sVar1;
      if (sVar1 < local_28) {
        local_78 = local_28;
        local_30 = local_28;
        local_28 = sVar1;
      }
    }
    while (local_28 <= local_30) {
      *local_18 = local_8[local_28];
      local_28 = local_28 + 1;
      local_18 = local_18 + 1;
    }
    in_stack_fffffffffffffe50 = local_58;
    if (local_58[0] < 0x29) {
      lVar3 = (long)(int)local_58[0];
      local_58[0] = local_58[0] + 8;
      in_stack_fffffffffffffe48 = (int *)(local_48 + lVar3);
    }
    else {
      in_stack_fffffffffffffe48 = local_50;
      local_50 = local_50 + 2;
    }
    local_8 = *(char **)in_stack_fffffffffffffe48;
  }
  *local_18 = '\0';
  return local_10;
}

Assistant:

char *
zt_cstr_catv(const char *s, ...) {
    char       * new;
    char       * p;
    const char * save = s;
    ssize_t      i;
    ssize_t      j;
    size_t       len  = 0;
    va_list      ap;

    va_start(ap, s);

    /* calculate the lentgh */
    while (s) {
        i    = va_arg(ap, int);
        j    = va_arg(ap, int);
        CONVERT(s, i, j);
        len += IDXLEN(i, j) + 1;
        s    = va_arg(ap, const char *);
    }

    va_end(ap);

    p = new = zt_malloc(char, len + 1);
    s = save;
    va_start(ap, s);

    while (s) {
        i = va_arg(ap, int);
        j = va_arg(ap, int);
        CONVERT(s, i, j);

        while (i <= j) {
            *p++ = s[i++];
        }
        s = va_arg(ap, const char *);
    }

    *p = '\0';
    return new;
}